

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O3

ostream * setup::operator<<(ostream *os,windows_version *version)

{
  uint uVar1;
  size_t sVar2;
  ostream *poVar3;
  uint uVar4;
  long lVar5;
  char *__s;
  char *__s_00;
  bool bVar6;
  char local_2a [2];
  
  operator<<(os,&version->win_version);
  if ((((version->nt_version).build != (version->win_version).build) ||
      (uVar1 = (version->nt_version).major, uVar1 != (version->win_version).major)) ||
     (uVar4 = (version->nt_version).minor, uVar4 != (version->win_version).minor)) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"  nt ",5);
    operator<<(os,&version->nt_version);
    uVar1 = (version->win_version).major;
    uVar4 = (version->win_version).minor;
  }
  lVar5 = 0xc;
  __s_00 = (char *)0x0;
  do {
    if ((*(uint *)((anonymous_namespace)::windows_nt_version_names + lVar5 + 0x11c) == uVar1) &&
       (uVar4 <= *(uint *)((anonymous_namespace)::windows_version_names + lVar5))) {
      __s_00 = *(char **)((anonymous_namespace)::windows_nt_version_names + lVar5 + 0x114);
      break;
    }
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0xcc);
  uVar1 = (version->nt_version).major;
  uVar4 = (version->nt_version).minor;
  if (((uVar1 == 10) && (uVar4 == 0)) && (21999 < (version->nt_version).build)) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    bVar6 = true;
    __s = "Windows 11";
  }
  else {
    lVar5 = 0xc;
    __s = (char *)0x0;
    do {
      if ((*(uint *)((long)&PTR_what_00170368 + lVar5 + 4) == uVar1) &&
         (uVar4 <= *(uint *)((anonymous_namespace)::windows_nt_version_names + lVar5))) {
        __s = *(char **)((long)&PTR__version_error_00170360 + lVar5 + 4);
        break;
      }
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 300);
    bVar6 = __s != (char *)0x0;
    if (__s_00 == (char *)0x0 && __s == (char *)0x0) goto LAB_001437d8;
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
  }
  if (__s_00 == (char *)0x0) {
    if ((bVar6) && (__s != (char *)0x0)) goto LAB_0014378f;
  }
  else {
    sVar2 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s_00,sVar2);
    if ((bVar6) && (__s != __s_00)) {
      std::__ostream_insert<char,std::char_traits<char>>(os," / ",3);
LAB_0014378f:
      if (__s == (char *)0x0) {
        std::ios::clear((int)os + (int)os->_vptr_basic_ostream[-3]);
      }
      else {
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar2);
      }
    }
  }
  local_2a[0] = ')';
  std::__ostream_insert<char,std::char_traits<char>>(os,local_2a,1);
LAB_001437d8:
  if ((version->nt_service_pack).minor != 0 || (version->nt_service_pack).major != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os," service pack ",0xe);
    std::ostream::_M_insert<unsigned_long>((ulong)os);
    if ((version->nt_service_pack).minor != 0) {
      local_2a[1] = 0x2e;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,local_2a + 1,1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    }
  }
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const windows_version & version) {
	
	os << version.win_version;
	if(version.nt_version != version.win_version) {
		os << "  nt " << version.nt_version;
	}
	
	const char * win_name = get_version_name(version.win_version);
	const char * nt_name = get_version_name(version.nt_version, true);
	
	if(win_name || nt_name) {
		os << " (";
		if(win_name) {
			os << win_name;
		}
		if(nt_name && nt_name != win_name) {
			if(win_name) {
				os << " / ";
			}
			os << nt_name;
		}
		os << ')';
	}
	
	if(version.nt_service_pack.major || version.nt_service_pack.minor) {
		os << " service pack " << version.nt_service_pack.major;
		if(version.nt_service_pack.minor) {
			os << '.' << version.nt_service_pack.minor;
		}
	}
	
	return os;
}